

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::SymbolIterator::Update
          (SymbolIterator *this,uint32_t increment)

{
  byte bVar1;
  Elf64_Word offset;
  ElfMemImage *this_00;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  Elf64_Versym *pEVar10;
  Elf64_Verdef *pEVar11;
  void *pvVar12;
  size_t sVar13;
  ulong uVar14;
  ReturnAddress RVar15;
  char cVar16;
  long extraout_RDX;
  long lVar17;
  long lVar18;
  SymbolIterator *unaff_RBX;
  int iVar19;
  Elf64_Versym *unaff_RBP;
  uint32_t index;
  undefined4 in_register_00000034;
  char *pcVar20;
  ElfMemImage *pEVar21;
  char *unaff_R12;
  char *unaff_R13;
  Elf64_Sym *unaff_R15;
  int iStack_21c;
  RustSymbolParser RStack_218;
  State SStack_68;
  
  pcVar20 = (char *)CONCAT44(in_register_00000034,increment);
  this_00 = (ElfMemImage *)this->image_;
  if (increment == 0 || this_00->ehdr_ != (Elf64_Ehdr *)0x0) {
    if (this_00->ehdr_ == (Elf64_Ehdr *)0x0) {
      return;
    }
    index = increment + this->index_;
    this->index_ = index;
    if (this_00->num_syms_ <= index) {
      this->index_ = this_00->num_syms_;
      return;
    }
    SStack_68.parse_state._12_4_ = 0x37db23;
    SStack_68._44_4_ = 0;
    unaff_R15 = GetDynsym(this_00,index);
    pcVar20 = (char *)(ulong)this->index_;
    SStack_68.parse_state._12_4_ = 0x37db31;
    SStack_68._44_4_ = 0;
    pEVar21 = this_00;
    pEVar10 = GetVersym(this_00,this->index_);
    unaff_RBX = this;
    if ((unaff_R15 != (Elf64_Sym *)0x0) && (unaff_RBP = pEVar10, pEVar10 != (Elf64_Versym *)0x0)) {
      SStack_68.parse_state._12_4_ = 0x37db51;
      SStack_68._44_4_ = 0;
      unaff_R12 = GetDynstr(this_00,unaff_R15->st_name);
      unaff_R13 = "";
      if (unaff_R15->st_shndx == 0) {
LAB_0037db95:
        (this->info_).name = unaff_R12;
        (this->info_).version = unaff_R13;
        SStack_68.parse_state._12_4_ = 0x37dba7;
        SStack_68._44_4_ = 0;
        pvVar12 = GetSymAddr(this_00,unaff_R15);
        (this->info_).address = pvVar12;
        (this->info_).symbol = unaff_R15;
        return;
      }
      pcVar20 = (char *)(ulong)(*pEVar10 & 0x7fff);
      SStack_68.parse_state._12_4_ = 0x37db75;
      SStack_68._44_4_ = 0;
      pEVar21 = this_00;
      pEVar11 = GetVerdef(this_00,*pEVar10 & 0x7fff);
      if (pEVar11 == (Elf64_Verdef *)0x0) goto LAB_0037db95;
      if (0xfffd < (ushort)(pEVar11->vd_cnt - 3)) {
        offset._0_2_ = pEVar11[1].vd_version;
        offset._2_2_ = pEVar11[1].vd_flags;
        SStack_68.parse_state._12_4_ = 0x37db92;
        SStack_68._44_4_ = 0;
        unaff_R13 = GetVerstr(this_00,offset);
        goto LAB_0037db95;
      }
      goto LAB_0037dbcd;
    }
  }
  else {
    SStack_68.parse_state._12_4_ = 0x37dbc8;
    SStack_68._44_4_ = 0;
    Update();
    pEVar21 = (ElfMemImage *)this;
  }
  SStack_68.parse_state._12_4_ = 0x37dbcd;
  SStack_68._44_4_ = 0;
  Update();
LAB_0037dbcd:
  SStack_68.parse_state._12_4_ = 0x37dbd2;
  SStack_68._44_4_ = 0;
  Update();
  if ((*(char *)&pEVar21->ehdr_ != '_') || (*(char *)((long)&pEVar21->ehdr_ + 1) != 'R')) {
    SStack_68.out_end_idx = (int)extraout_RDX;
    SStack_68.parse_state.prev_name_idx = 0;
    SStack_68.parse_state._12_4_ = 0xffff0000;
    SStack_68.parse_state.mangled_idx = 0;
    SStack_68.parse_state.out_cur_idx = 0;
    SStack_68.recursion_depth = 1;
    SStack_68.steps = 1;
    RStack_218.out_ = (char *)0x37dc22;
    SStack_68.mangled_begin = (char *)pEVar21;
    SStack_68.out = pcVar20;
    bVar7 = ParseMangledName(&SStack_68);
    if (bVar7) {
      lVar17 = (long)SStack_68.parse_state.mangled_idx;
      cVar16 = *(char *)((long)(Elf64_Ehdr **)SStack_68.mangled_begin + lVar17);
      if (cVar16 != '\0') {
        pcVar20 = (char *)((long)(Elf64_Ehdr **)SStack_68.mangled_begin + lVar17);
        lVar18 = 0;
        do {
          if (pcVar20[lVar18] != '.') {
            if (pcVar20[lVar18] == '\0') {
              return;
            }
            break;
          }
          bVar8 = pcVar20[lVar18 + 1];
          bVar7 = (byte)((bVar8 & 0xdf) + 0xbf) < 0x1a;
          if (bVar8 == 0x5f || bVar7) {
            lVar18 = lVar18 + 1;
            do {
              do {
                bVar1 = *(byte *)((long)(Elf64_Ehdr **)SStack_68.mangled_begin + lVar18 + lVar17 + 1
                                 );
                lVar18 = lVar18 + 1;
              } while (bVar1 == 0x5f);
            } while ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
            bVar2 = true;
            if (bVar1 == 0x2e) goto LAB_0037dcad;
          }
          else {
LAB_0037dcad:
            bVar2 = bVar8 == 0x5f || bVar7;
            if ((byte)(pcVar20[lVar18 + 1] - 0x30U) < 10) {
              lVar18 = lVar18 + 1;
              do {
                lVar4 = lVar18 + lVar17 + 1;
                lVar18 = lVar18 + 1;
              } while ((byte)(*(char *)((long)(Elf64_Ehdr **)SStack_68.mangled_begin + lVar4) -
                             0x30U) < 10);
              bVar2 = true;
            }
          }
        } while (bVar2);
        if (cVar16 == '@') {
          RStack_218.out_ = (char *)0x37dcf6;
          MaybeAppend(&SStack_68,pcVar20);
        }
      }
    }
    return;
  }
  SStack_68.parse_state._12_4_ = SUB84(unaff_RBP,0);
  SStack_68._44_4_ = SUB84((ulong)unaff_RBP >> 0x20,0);
  SStack_68.parse_state.out_cur_idx = (int)unaff_R15;
  SStack_68.parse_state.prev_name_idx = (int)((ulong)unaff_R15 >> 0x20);
  SStack_68.steps = (int)this_00;
  SStack_68.parse_state.mangled_idx = (int)((ulong)this_00 >> 0x20);
  SStack_68.out_end_idx = (int)unaff_R13;
  SStack_68.recursion_depth = (int)((ulong)unaff_R13 >> 0x20);
  SStack_68.mangled_begin = (char *)unaff_RBX;
  SStack_68.out = unaff_R12;
  memset(&RStack_218,0,400);
  RStack_218.encoding_ = (char *)pEVar21;
  RStack_218.out_ = pcVar20;
  RStack_218.out_end_ = pcVar20 + extraout_RDX;
  if (extraout_RDX != 0) {
    *pcVar20 = '\0';
  }
  if ((*(char *)&pEVar21->ehdr_ != '_') || (iVar19 = 0, *(char *)((long)&pEVar21->ehdr_ + 1) != 'R')
     ) {
    return;
  }
  RStack_218.recursion_depth_ = 1;
  RStack_218.recursion_stack_[0] = kInstantiatingCrate;
  RStack_218.pos_ = 2;
  do {
    lVar17 = (long)RStack_218.pos_ + 1;
    uVar9 = (uint)lVar17;
    bVar8 = *(byte *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_);
    if (bVar8 < 0x4d) {
      if (bVar8 == 0x42) {
        RStack_218.pos_ = uVar9;
        bVar7 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_218);
        if (!bVar7) {
          return;
        }
        if (RStack_218.silence_depth_ != 0) goto switchD_0038243b_caseD_1c;
        lVar17 = (long)RStack_218.recursion_depth_;
        if (lVar17 == 0x100) {
          return;
        }
        RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
        RStack_218.recursion_stack_[lVar17] = kPathBackrefEnding;
      }
      else {
        if (bVar8 == 0x43) {
          RStack_218.pos_ = uVar9;
          bVar7 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&RStack_218,'\0');
          if (bVar7) goto LAB_003823fb;
          return;
        }
        if (bVar8 != 0x49) {
          return;
        }
        lVar17 = (long)RStack_218.recursion_depth_;
        if (lVar17 == 0x100) {
          return;
        }
        RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
        RStack_218.pos_ = uVar9;
        RStack_218.recursion_stack_[lVar17] = kBeginGenericArgList;
      }
    }
    else {
      if (bVar8 < 0x58) {
        if (bVar8 != 0x4d) {
          if (bVar8 != 0x4e) {
            return;
          }
          RStack_218.pos_ = RStack_218.pos_ + 2;
          if ((byte)(*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17) + 0xbfU) < 0x1a)
          {
            lVar18 = (long)RStack_218.namespace_depth_;
            if (lVar18 == 0x40) {
              return;
            }
            RStack_218.namespace_depth_ = RStack_218.namespace_depth_ + 1;
            RStack_218.namespace_stack_[lVar18] =
                 *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17);
            lVar17 = (long)RStack_218.recursion_depth_;
            if (lVar17 == 0x100) {
              return;
            }
            RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
            RStack_218.recursion_stack_[lVar17] = kIdentifierInUppercaseNamespace;
          }
          else {
            if (0x19 < (byte)(*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17) + 0x9fU)
               ) {
              return;
            }
            lVar17 = (long)RStack_218.recursion_depth_;
            if (lVar17 == 0x100) {
              return;
            }
            RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
            RStack_218.recursion_stack_[lVar17] = kIdentifierInLowercaseNamespace;
          }
          goto switchD_00381f7b_caseD_43;
        }
        if (RStack_218.silence_depth_ < 1) {
          if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
            return;
          }
          RStack_218.out_[0] = '<';
          RStack_218.out_[1] = '\0';
          RStack_218.out_ = RStack_218.out_ + 1;
        }
        RVar15 = kInherentImplType;
      }
      else {
        if (bVar8 != 0x58) {
          if (bVar8 != 0x59) {
            return;
          }
          if (RStack_218.silence_depth_ < 1) {
            if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
              return;
            }
            RStack_218.out_[0] = '<';
            RStack_218.out_[1] = '\0';
            RStack_218.out_ = RStack_218.out_ + 1;
          }
          lVar17 = (long)RStack_218.recursion_depth_;
          if (lVar17 == 0x100) {
            return;
          }
          RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
          RStack_218.pos_ = uVar9;
          RStack_218.recursion_stack_[lVar17] = kTraitDefinitionInfix;
          uVar9 = RStack_218.pos_;
LAB_00381f3a:
          RStack_218.pos_ = uVar9;
          lVar17 = (long)RStack_218.pos_;
          cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17);
          if ((byte)(cVar16 + 0x9fU) < 0x1a) {
            RStack_218.pos_ = RStack_218.pos_ + 1;
            bVar8 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17) + 0x9f;
            if (0x19 < bVar8) {
              return;
            }
            if ((0x3bcfbbfU >> (bVar8 & 0x1f) & 1) == 0) {
              return;
            }
            if (0 < RStack_218.silence_depth_) goto LAB_003823fb;
            pcVar20 = *(char **)(&DAT_00574840 + (ulong)bVar8 * 8);
            sVar13 = strlen(pcVar20);
            pcVar6 = RStack_218.out_;
            if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < sVar13 + 1) {
              return;
            }
            memcpy(RStack_218.out_,pcVar20,sVar13 + 1);
            RStack_218.out_ = pcVar6 + sVar13;
            goto LAB_003823fb;
          }
          switch(cVar16) {
          case 'A':
            RStack_218.pos_ = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                return;
              }
              RStack_218.out_[0] = '[';
              RStack_218.out_[1] = '\0';
              RStack_218.out_ = RStack_218.out_ + 1;
            }
            RVar15 = kArraySize;
            break;
          case 'B':
            RStack_218.pos_ = RStack_218.pos_ + 1;
            bVar7 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_218);
            if (!bVar7) {
              return;
            }
            if (RStack_218.silence_depth_ != 0) {
switchD_0038243b_caseD_1c:
              lVar17 = (long)RStack_218.position_depth_;
              RStack_218.position_depth_ = RStack_218.position_depth_ + -1;
              RStack_218.pos_ = RStack_218.position_stack_[lVar17 + -1];
LAB_003823fb:
              if (0x1fffe < iVar19) {
                return;
              }
              uVar9 = RStack_218.recursion_depth_;
              if (RStack_218.recursion_depth_ < 1) {
                return;
              }
              do {
                pcVar20 = RStack_218.out_;
                iVar5 = RStack_218.silence_depth_;
                iVar19 = iVar19 + 1;
                RStack_218.recursion_depth_ = uVar9 - 1;
                switch(RStack_218.recursion_stack_[(uint)RStack_218.recursion_depth_]) {
                case kInstantiatingCrate:
                  if (0x19 < (byte)((*(byte *)((long)(Elf64_Ehdr **)RStack_218.encoding_ +
                                              (long)RStack_218.pos_) & 0xdf) + 0xbf)) {
                    return;
                  }
                  RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kVendorSpecificSuffix;
                  goto switchD_00381f7b_caseD_43;
                case kVendorSpecificSuffix:
                  return;
                case kIdentifierInUppercaseNamespace:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                      return;
                    }
                    RStack_218.out_[2] = '\0';
                    RStack_218.out_[0] = ':';
                    RStack_218.out_[1] = ':';
                    RStack_218.out_ = RStack_218.out_ + 2;
                  }
                  lVar17 = (long)RStack_218.namespace_depth_;
                  RStack_218.namespace_depth_ = RStack_218.namespace_depth_ + -1;
                  bVar7 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                    (&RStack_218,RStack_218.namespace_stack_[lVar17 + -1]);
                  goto LAB_0038294c;
                case kIdentifierInLowercaseNamespace:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                      return;
                    }
                    RStack_218.out_[2] = '\0';
                    RStack_218.out_[0] = ':';
                    RStack_218.out_[1] = ':';
                    RStack_218.out_ = RStack_218.out_ + 2;
                  }
                  bVar7 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&RStack_218,'\0');
LAB_0038294c:
                  if (bVar7 == false) {
                    return;
                  }
                  if (iVar19 == 0x1ffff) {
                    return;
                  }
                  goto LAB_00382b78;
                case kInherentImplType:
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kInherentImplEnding;
                  uVar9 = RStack_218.pos_;
                  goto LAB_00381f3a;
                case kInherentImplEnding:
                case kTraitImplEnding:
                case kTraitDefinitionEnding:
                  if (0 < RStack_218.silence_depth_) break;
                  if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                    return;
                  }
                  RStack_218.out_[0] = '>';
                  RStack_218.out_[1] = '\0';
                  goto LAB_00382b64;
                case kTraitImplType:
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kTraitImplInfix;
                  uVar9 = RStack_218.pos_;
                  goto LAB_00381f3a;
                case kTraitImplInfix:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 5) {
                      return;
                    }
                    builtin_strncpy(RStack_218.out_," as ",5);
                    RStack_218.out_ = RStack_218.out_ + 4;
                  }
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kTraitImplEnding;
                  goto switchD_00381f7b_caseD_43;
                case kImplPathEnding:
                case kFinishFn:
                  goto switchD_0038243b_caseD_9;
                case kTraitDefinitionInfix:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 5) {
                      return;
                    }
                    builtin_strncpy(RStack_218.out_," as ",5);
                    RStack_218.out_ = RStack_218.out_ + 4;
                  }
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kTraitDefinitionEnding;
                  goto switchD_00381f7b_caseD_43;
                case kArraySize:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                      return;
                    }
                    RStack_218.out_[2] = '\0';
                    RStack_218.out_[0] = ';';
                    RStack_218.out_[1] = ' ';
                    RStack_218.out_ = RStack_218.out_ + 2;
                  }
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kFinishArray;
                  goto LAB_00382a9d;
                case kFinishArray:
                case kSliceEnding:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                      return;
                    }
                    RStack_218.out_[0] = ']';
                    RStack_218.out_[1] = '\0';
                    goto LAB_00382b64;
                  }
                  break;
                case kAfterFirstTupleElement:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      != 'E') {
                    if (RStack_218.silence_depth_ < 1) {
                      if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                        return;
                      }
                      RStack_218.out_[2] = '\0';
                      RStack_218.out_[0] = ',';
                      RStack_218.out_[1] = ' ';
                      RStack_218.out_ = RStack_218.out_ + 2;
                    }
                    if (RStack_218.recursion_depth_ == 0x100) {
                      return;
                    }
                    uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                    RStack_218.recursion_depth_ = uVar9;
                    RStack_218.recursion_stack_[uVar14] = kAfterSecondTupleElement;
                    uVar9 = RStack_218.pos_;
                    goto LAB_00381f3a;
                  }
                  RStack_218.pos_ = RStack_218.pos_ + 1;
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                      return;
                    }
                    RStack_218.out_[2] = '\0';
                    RStack_218.out_[0] = ',';
                    RStack_218.out_[1] = ')';
                    RStack_218.out_ = RStack_218.out_ + 2;
                  }
                  break;
                case kAfterSecondTupleElement:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      == 'E') {
                    RStack_218.pos_ = RStack_218.pos_ + 1;
                    goto LAB_003827e9;
                  }
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                      return;
                    }
                    RStack_218.out_[2] = '\0';
                    RStack_218.out_[0] = ',';
                    RStack_218.out_[1] = ' ';
                    RStack_218.out_ = RStack_218.out_ + 2;
                  }
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kAfterThirdTupleElement;
                  uVar9 = RStack_218.pos_;
                  goto LAB_00381f3a;
                case kAfterThirdTupleElement:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      != 'E') {
                    if (RStack_218.silence_depth_ < 1) {
                      if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 7) {
                        return;
                      }
                      builtin_strncpy(RStack_218.out_,", ...)",7);
                      RStack_218.out_ = RStack_218.out_ + 6;
                    }
                    RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
                    goto LAB_003829b5;
                  }
                  RStack_218.pos_ = RStack_218.pos_ + 1;
LAB_003827e9:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                      return;
                    }
                    RStack_218.out_[0] = ')';
                    RStack_218.out_[1] = '\0';
LAB_00382b64:
                    RStack_218.out_ = RStack_218.out_ + 1;
                  }
                  break;
                case kAfterSubsequentTupleElement:
LAB_003829b5:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      == 'E') {
                    RStack_218.pos_ = RStack_218.pos_ + 1;
                    goto switchD_0038243b_caseD_9;
                  }
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kAfterSubsequentTupleElement;
                  uVar9 = RStack_218.pos_;
                  goto LAB_00381f3a;
                case kContinueParameterList:
                  goto switchD_0038243b_caseD_13;
                case kBeginAutoTraits:
                case kContinueAutoTraits:
                  goto switchD_0038243b_caseD_15;
                case kContinueDynTrait:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      == 'p') {
                    if (RStack_218.silence_depth_ < 1) {
                      if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                        return;
                      }
                      RStack_218.out_[2] = '\0';
                      RStack_218.out_[0] = '<';
                      RStack_218.out_[1] = '>';
                      RStack_218.out_ = RStack_218.out_ + 2;
                    }
                    RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
                    goto LAB_00382880;
                  }
                  break;
                case kContinueAssocBinding:
LAB_00382880:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      == 'p') {
                    RStack_218.pos_ = RStack_218.pos_ + 1;
                    bVar7 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                      (&RStack_218,'\0',0);
                    if (!bVar7) {
                      return;
                    }
                    lVar17 = (long)RStack_218.recursion_depth_;
                    if (lVar17 == 0x100) {
                      return;
                    }
                    RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
                    RStack_218.recursion_stack_[lVar17] = kContinueAssocBinding;
                    uVar9 = RStack_218.pos_;
                    goto LAB_00381f3a;
                  }
switchD_0038243b_caseD_9:
                  RStack_218.silence_depth_ = RStack_218.silence_depth_ + -1;
                  break;
                case kConstData:
                  RStack_218.silence_depth_ = RStack_218.silence_depth_ + -1;
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      == 'n') {
                    RStack_218.pos_ = RStack_218.pos_ + 1;
                    bVar7 = true;
                    if (iVar5 < 2) {
                      if ((long)RStack_218.out_end_ - (long)RStack_218.out_ < 2) {
                        return;
                      }
                      RStack_218.out_ = RStack_218.out_ + 1;
                      *pcVar20 = '-';
                      *RStack_218.out_ = '\0';
                      goto LAB_0038251c;
                    }
                  }
                  else {
LAB_0038251c:
                    bVar7 = true;
                    if (RStack_218.silence_depth_ < 1) {
                      if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 3) {
                        return;
                      }
                      RStack_218.out_[2] = '\0';
                      RStack_218.out_[0] = '0';
                      RStack_218.out_[1] = 'x';
                      RStack_218.out_ = RStack_218.out_ + 2;
                      bVar7 = false;
                    }
                  }
                  pcVar20 = RStack_218.out_;
                  uVar14 = (ulong)RStack_218.pos_;
                  cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + uVar14);
                  if (cVar16 == '0') {
                    if (!bVar7) {
                      if ((long)RStack_218.out_end_ - (long)RStack_218.out_ < 2) {
                        return;
                      }
                      RStack_218.out_ = RStack_218.out_ + 1;
                      *pcVar20 = '0';
                      *RStack_218.out_ = '\0';
                    }
                    if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ +
                                 (long)(int)(RStack_218.pos_ + 1)) != '_') {
                      return;
                    }
                    RStack_218.pos_ = RStack_218.pos_ + 2;
                  }
                  else {
                    uVar3 = uVar14;
                    if ((byte)(cVar16 - 0x30U) < 10 || (byte)(cVar16 + 0x9fU) < 6) {
                      do {
                        pcVar20 = RStack_218.out_;
                        RStack_218.pos_ = (int)uVar14 + 1;
                        if (RStack_218.silence_depth_ < 1) {
                          if ((long)RStack_218.out_end_ - (long)RStack_218.out_ < 2) {
                            return;
                          }
                          RStack_218.out_ = RStack_218.out_ + 1;
                          *pcVar20 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + uVar3);
                          *RStack_218.out_ = '\0';
                        }
                        uVar14 = (ulong)(uint)RStack_218.pos_;
                        cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ +
                                          (long)RStack_218.pos_);
                        uVar3 = (long)RStack_218.pos_;
                      } while ((byte)(cVar16 + 0x9fU) < 6 || (byte)(cVar16 - 0x30U) < 10);
                    }
                    if (cVar16 != '_') {
                      return;
                    }
                    RStack_218.pos_ = RStack_218.pos_ + 1;
                  }
                  break;
                case kBeginGenericArgList:
                  if (RStack_218.silence_depth_ < 1) {
                    if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 5) {
                      return;
                    }
                    builtin_strncpy(RStack_218.out_,"::<>",5);
                    RStack_218.out_ = RStack_218.out_ + 4;
                  }
                  RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
                case kContinueGenericArgList:
                  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_)
                      == 'E') {
                    RStack_218.pos_ = RStack_218.pos_ + 1;
                    goto switchD_0038243b_caseD_9;
                  }
                  if (RStack_218.recursion_depth_ == 0x100) {
                    return;
                  }
                  uVar14 = (ulong)(uint)RStack_218.recursion_depth_;
                  RStack_218.recursion_depth_ = uVar9;
                  RStack_218.recursion_stack_[uVar14] = kContinueGenericArgList;
                  cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ +
                                    (long)RStack_218.pos_);
                  if (cVar16 == 'K') {
                    RStack_218.pos_ = RStack_218.pos_ + 1;
LAB_00382a9d:
                    uVar14 = (ulong)(uint)RStack_218.pos_;
                    cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ +
                                      (long)RStack_218.pos_);
                    while (cVar16 == 'B') {
                      RStack_218.pos_ = (int)uVar14 + 1;
                      bVar7 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_218);
                      if (!bVar7) {
                        return;
                      }
                      if (RStack_218.silence_depth_ != 0) goto switchD_0038243b_caseD_1e;
                      lVar17 = (long)RStack_218.recursion_depth_;
                      if (lVar17 == 0x100) {
                        return;
                      }
                      RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
                      RStack_218.recursion_stack_[lVar17] = kConstantBackrefEnding;
                      uVar14 = (ulong)RStack_218.pos_;
                      cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + uVar14);
                    }
                    if (cVar16 == 'p') {
                      RStack_218.pos_ = (int)uVar14 + 1;
                      if (0 < RStack_218.silence_depth_) break;
                      if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                        return;
                      }
                      RStack_218.out_[0] = '_';
                      RStack_218.out_[1] = '\0';
                      goto LAB_00382b64;
                    }
                    RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
                    lVar17 = (long)RStack_218.recursion_depth_;
                    if (lVar17 == 0x100) {
                      return;
                    }
                    RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
                    RStack_218.recursion_stack_[lVar17] = kConstData;
                    uVar9 = RStack_218.pos_;
                  }
                  else {
                    uVar9 = RStack_218.pos_;
                    if (cVar16 == 'L') {
                      RStack_218.pos_ = RStack_218.pos_ + 1;
                      bVar7 = anon_unknown_0::RustSymbolParser::ParseBase62Number
                                        (&RStack_218,&iStack_21c);
                      goto LAB_0038294c;
                    }
                  }
                  goto LAB_00381f3a;
                case kPathBackrefEnding:
                case kTypeBackrefEnding:
                  goto switchD_0038243b_caseD_1c;
                case kConstantBackrefEnding:
switchD_0038243b_caseD_1e:
                  lVar17 = (long)RStack_218.position_depth_;
                  RStack_218.position_depth_ = RStack_218.position_depth_ + -1;
                  RStack_218.pos_ = RStack_218.position_stack_[lVar17 + -1];
                }
                if (iVar19 == 0x1ffff) {
                  return;
                }
LAB_00382b78:
                uVar9 = RStack_218.recursion_depth_;
                if (RStack_218.recursion_depth_ < 1) {
                  return;
                }
              } while( true );
            }
            RVar15 = kTypeBackrefEnding;
            break;
          default:
            goto switchD_00381f7b_caseD_43;
          case 'D':
            RStack_218.pos_ = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 5) {
                return;
              }
              builtin_strncpy(RStack_218.out_,"dyn ",5);
              RStack_218.out_ = RStack_218.out_ + 4;
            }
            bVar7 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&RStack_218);
            if (!bVar7) {
              return;
            }
            if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_) == 'E')
            goto LAB_00382d86;
            RVar15 = kBeginAutoTraits;
LAB_00382ea5:
            if (RStack_218.recursion_depth_ == 0x100) {
              return;
            }
            lVar17 = (long)RStack_218.recursion_depth_;
            RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
            RStack_218.recursion_stack_[lVar17] = RVar15;
            lVar17 = (long)RStack_218.recursion_depth_;
            if (lVar17 == 0x100) {
              return;
            }
            RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
            RStack_218.recursion_stack_[lVar17] = kContinueDynTrait;
            goto switchD_00381f7b_caseD_43;
          case 'F':
            RStack_218.pos_ = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 6) {
                return;
              }
              builtin_strncpy(RStack_218.out_,"fn...",6);
              RStack_218.out_ = RStack_218.out_ + 5;
            }
            RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
            bVar7 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&RStack_218);
            if (!bVar7) {
              return;
            }
            lVar17 = (long)RStack_218.pos_;
            cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17);
            if (cVar16 == 'U') {
              RStack_218.pos_ = RStack_218.pos_ + 1;
              cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + lVar17 + 1);
            }
            if (cVar16 == 'K') {
              if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_ + 1)
                  == 'C') {
                RStack_218.pos_ = RStack_218.pos_ + 2;
              }
              else {
                RStack_218.pos_ = RStack_218.pos_ + 1;
                bVar7 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                  (&RStack_218,'\0',0);
                if (!bVar7) {
                  return;
                }
              }
            }
switchD_0038243b_caseD_13:
            if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_) == 'E')
            {
              RStack_218.pos_ = RStack_218.pos_ + 1;
              lVar17 = (long)RStack_218.recursion_depth_;
              if (lVar17 == 0x100) {
                return;
              }
              RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
              RStack_218.recursion_stack_[lVar17] = kFinishFn;
              uVar9 = RStack_218.pos_;
            }
            else {
              lVar17 = (long)RStack_218.recursion_depth_;
              if (lVar17 == 0x100) {
                return;
              }
              RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
              RStack_218.recursion_stack_[lVar17] = kContinueParameterList;
              uVar9 = RStack_218.pos_;
            }
            goto LAB_00381f3a;
          case 'O':
            uVar9 = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 6) {
                return;
              }
              builtin_strncpy(RStack_218.out_,"*mut ",6);
              RStack_218.out_ = RStack_218.out_ + 5;
            }
            goto LAB_00381f3a;
          case 'P':
            uVar9 = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 8) {
                return;
              }
              builtin_strncpy(RStack_218.out_,"*const ",8);
              RStack_218.out_ = RStack_218.out_ + 7;
            }
            goto LAB_00381f3a;
          case 'Q':
            uVar9 = (uint)((long)RStack_218.pos_ + 1);
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 6) {
                return;
              }
              builtin_strncpy(RStack_218.out_,"&mut ",6);
              RStack_218.out_ = RStack_218.out_ + 5;
            }
            cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_ + 1
                              );
            goto joined_r0x0038206a;
          case 'R':
            uVar9 = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                return;
              }
              RStack_218.out_[0] = '&';
              RStack_218.out_[1] = '\0';
              RStack_218.out_ = RStack_218.out_ + 1;
            }
            cVar16 = *(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)(int)uVar9);
joined_r0x0038206a:
            if (cVar16 == 'L') {
              RStack_218.pos_ = RStack_218.pos_ + 2;
              bVar7 = anon_unknown_0::RustSymbolParser::ParseBase62Number(&RStack_218,&iStack_21c);
              uVar9 = RStack_218.pos_;
              if (!bVar7) {
                return;
              }
            }
            goto LAB_00381f3a;
          case 'S':
            RStack_218.pos_ = RStack_218.pos_ + 1;
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                return;
              }
              RStack_218.out_[0] = '[';
              RStack_218.out_[1] = '\0';
              RStack_218.out_ = RStack_218.out_ + 1;
            }
            RVar15 = kSliceEnding;
            break;
          case 'T':
            if (RStack_218.silence_depth_ < 1) {
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                return;
              }
              RStack_218.out_[0] = '(';
              RStack_218.out_[1] = '\0';
              RStack_218.out_ = RStack_218.out_ + 1;
            }
            if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ +
                         (long)(int)(RStack_218.pos_ + 1U)) == 'E') {
              RStack_218.pos_ = RStack_218.pos_ + 2;
              if (0 < RStack_218.silence_depth_) goto LAB_003823fb;
              if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
                return;
              }
              RStack_218.out_[0] = ')';
              RStack_218.out_[1] = '\0';
              RStack_218.out_ = RStack_218.out_ + 1;
              goto LAB_003823fb;
            }
            RVar15 = kAfterFirstTupleElement;
            RStack_218.pos_ = RStack_218.pos_ + 1U;
          }
          if (RStack_218.recursion_depth_ == 0x100) {
            return;
          }
          lVar17 = (long)RStack_218.recursion_depth_;
          RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
          RStack_218.recursion_stack_[lVar17] = RVar15;
          uVar9 = RStack_218.pos_;
          goto LAB_00381f3a;
        }
        if (RStack_218.silence_depth_ < 1) {
          if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 2) {
            return;
          }
          RStack_218.out_[0] = '<';
          RStack_218.out_[1] = '\0';
          RStack_218.out_ = RStack_218.out_ + 1;
        }
        RVar15 = kTraitImplType;
      }
      if (RStack_218.recursion_depth_ == 0x100) {
        return;
      }
      lVar17 = (long)RStack_218.recursion_depth_;
      RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
      RStack_218.pos_ = uVar9;
      RStack_218.recursion_stack_[lVar17] = RVar15;
      RStack_218.silence_depth_ = RStack_218.silence_depth_ + 1;
      bVar7 = anon_unknown_0::RustSymbolParser::ParseDisambiguator(&RStack_218,&iStack_21c);
      if (!bVar7) {
        return;
      }
      lVar17 = (long)RStack_218.recursion_depth_;
      if (lVar17 == 0x100) {
        return;
      }
      RStack_218.recursion_depth_ = RStack_218.recursion_depth_ + 1;
      RStack_218.recursion_stack_[lVar17] = kImplPathEnding;
    }
switchD_00381f7b_caseD_43:
  } while( true );
switchD_0038243b_caseD_15:
  if (*(char *)((long)(Elf64_Ehdr **)RStack_218.encoding_ + (long)RStack_218.pos_) != 'E') {
    if (RStack_218.silence_depth_ < 1) {
      if ((ulong)((long)RStack_218.out_end_ - (long)RStack_218.out_) < 4) {
        return;
      }
      builtin_strncpy(RStack_218.out_," + ",4);
      RStack_218.out_ = RStack_218.out_ + 3;
    }
    RVar15 = kContinueAutoTraits;
    goto LAB_00382ea5;
  }
LAB_00382d86:
  RStack_218.pos_ = RStack_218.pos_ + 1;
  bVar7 = anon_unknown_0::RustSymbolParser::ParseRequiredLifetime(&RStack_218);
  if (!bVar7) {
    return;
  }
  goto LAB_003823fb;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(uint32_t increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}